

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client-http.c
# Opt level: O0

int lws_http_client_read(lws *wsi,char **buf,int *len)

{
  char cVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  int local_4c;
  uint local_48;
  int consumed;
  int n;
  int buffered;
  lws_tokens eb;
  lws_context_per_thread *pt;
  int *len_local;
  char **buf_local;
  lws *wsi_local;
  
  eb._8_8_ = wsi->context->pt + (int)wsi->tsi;
  local_4c = 0;
  _n = (uchar *)*buf;
  eb.token._0_4_ = *len;
  iVar2 = lws_buflist_aware_read
                    ((lws_context_per_thread *)eb._8_8_,wsi,(lws_tokens *)&n,'\0',
                     "lws_http_client_read");
  *buf = (char *)_n;
  *len = 0;
  iVar3 = lws_change_pollfd(wsi,0,1);
  if (iVar3 == 0) {
    if (iVar2 < 0) {
      _lws_log(0x10,"%s: SSL capable error\n","lws_http_client_read");
      wsi_local._4_4_ = -1;
    }
    else if ((int)eb.token < 1) {
      wsi_local._4_4_ = 0;
    }
    else {
      *len = (int)eb.token;
      *(ulong *)&wsi->field_0x2dc = *(ulong *)&wsi->field_0x2dc & 0xffff7fffffffffff;
      do {
        while( true ) {
          bVar4 = false;
          if ((((uint)((ulong)*(undefined8 *)&wsi->field_0x2dc >> 0x2e) & 1) != 0) &&
             (bVar4 = false, wsi->chunk_parser != '\x02')) {
            bVar4 = *len != 0;
          }
          if (!bVar4) break;
          switch(wsi->chunk_parser) {
          case '\0':
            if (**buf == '\r') {
              wsi->chunk_parser = '\x01';
            }
            else {
              cVar1 = char_to_hex(**buf);
              if (cVar1 < 0) {
                _lws_log(1,"%s: chunking failure A\n","lws_http_client_read");
                return -1;
              }
              wsi->chunk_remaining = wsi->chunk_remaining << 4;
              wsi->chunk_remaining = (int)cVar1 | wsi->chunk_remaining;
            }
            break;
          case '\x01':
            if (**buf != '\n') {
              _lws_log(1,"%s: chunking failure B\n","lws_http_client_read");
              return -1;
            }
            if (wsi->chunk_remaining == 0) {
              wsi->chunk_parser = '\x05';
            }
            else {
              wsi->chunk_parser = '\x02';
            }
            break;
          case '\x02':
            break;
          case '\x03':
            if (**buf != '\r') {
              _lws_log(1,"%s: chunking failure C\n","lws_http_client_read");
              lwsl_hexdump_level(1,*buf,(long)*len);
              return -1;
            }
            wsi->chunk_parser = '\x04';
            break;
          case '\x04':
            if (**buf != '\n') {
              _lws_log(1,"%s: chunking failure D\n","lws_http_client_read");
              return -1;
            }
            wsi->chunk_parser = '\0';
            wsi->chunk_remaining = 0;
            break;
          case '\x05':
            if (**buf != '\r') {
              _lws_log(1,"%s: chunking failure F\n","lws_http_client_read");
              lwsl_hexdump_level(1,*buf,(long)*len);
              return -1;
            }
            wsi->chunk_parser = '\x06';
            break;
          case '\x06':
            if (**buf != '\n') {
              _lws_log(1,"%s: chunking failure F\n","lws_http_client_read");
              lwsl_hexdump_level(1,*buf,(long)*len);
              return -1;
            }
            *buf = *buf + 1;
            *len = *len + -1;
            local_4c = local_4c + 1;
            _lws_log(8,"final chunk\n");
            goto LAB_0013b0b1;
          }
          *buf = *buf + 1;
          *len = *len + -1;
          local_4c = local_4c + 1;
        }
        if (((*(ulong *)&wsi->field_0x2dc >> 0x2e & 1) != 0) && (wsi->chunk_remaining == 0))
        goto LAB_0013b0e4;
        if (((wsi->http).rx_content_remain == 0) ||
           ((ulong)(uint)*len <= (wsi->http).rx_content_remain)) {
          local_48 = *len;
        }
        else {
          local_48 = (uint)(wsi->http).rx_content_remain;
        }
        if ((((*(ulong *)&wsi->field_0x2dc >> 0x2e & 1) != 0) && (wsi->chunk_remaining != 0)) &&
           (wsi->chunk_remaining < (int)local_48)) {
          local_48 = wsi->chunk_remaining;
        }
        if ((*(ulong *)&wsi->field_0x2dc >> 0x22 & 1) == 0) {
          _lws_log(4,"%s: swallowed read (%d)\n","lws_http_client_read",(ulong)local_48);
        }
        else {
          iVar3 = user_callback_handle_rxflow
                            (wsi->protocol->callback,wsi,LWS_CALLBACK_RECEIVE_CLIENT_HTTP_READ,
                             wsi->user_space,*buf,(long)(int)local_48);
          if (iVar3 != 0) {
            _lws_log(8,"%s: RECEIVE_CLIENT_HTTP_READ returned -1\n","lws_http_client_read");
            return -1;
          }
        }
        *buf = *buf + (int)local_48;
        *len = *len - local_48;
        if (((*(ulong *)&wsi->field_0x2dc >> 0x2e & 1) != 0) && (wsi->chunk_remaining != 0)) {
          wsi->chunk_remaining = wsi->chunk_remaining - local_48;
        }
        local_4c = local_48 + local_4c;
        if (((*(ulong *)&wsi->field_0x2dc >> 0x2e & 1) != 0) && (wsi->chunk_remaining == 0)) {
          wsi->chunk_parser = '\x03';
        }
      } while (((*(ulong *)&wsi->field_0x2dc >> 0x2e & 1) != 0) && (*len != 0));
      if ((*(ulong *)&wsi->field_0x2dc >> 0x2e & 1) == 0) {
        if ((wsi->http).rx_content_length != 0) {
          (wsi->http).rx_content_remain = (wsi->http).rx_content_remain - (long)(int)local_48;
        }
        if (((wsi->http).rx_content_remain == 0) && ((wsi->http).rx_content_length != 0)) {
LAB_0013b0b1:
          iVar3 = lws_http_transaction_completed_client(wsi);
          if (iVar3 != 0) {
            _lws_log(4,"%s: transaction completed says -1\n","lws_http_client_read");
            return -1;
          }
        }
      }
LAB_0013b0e4:
      iVar2 = lws_buflist_aware_finished_consuming
                        (wsi,(lws_tokens *)&n,local_4c,iVar2,"lws_http_client_read");
      if (iVar2 == 0) {
        wsi_local._4_4_ = 0;
      }
      else {
        wsi_local._4_4_ = -1;
      }
    }
  }
  else {
    wsi_local._4_4_ = -1;
  }
  return wsi_local._4_4_;
}

Assistant:

int
lws_http_client_read(struct lws *wsi, char **buf, int *len)
{
	struct lws_context_per_thread *pt = &wsi->context->pt[(int)wsi->tsi];
	struct lws_tokens eb;
	int buffered, n, consumed = 0;

	/*
	 * If the caller provided a non-NULL *buf and nonzero *len, we should
	 * use that as the buffer for the read action, limititing it to *len
	 * (actual payload will be less if chunked headers inside).
	 *
	 * If it's NULL / 0 length, buflist_aware_read will use the pt_serv_buf
	 */

	eb.token = (unsigned char *)*buf;
	eb.len = *len;

	buffered = lws_buflist_aware_read(pt, wsi, &eb, 0, __func__);
	*buf = (char *)eb.token; /* may be pointing to buflist or pt_serv_buf */
	*len = 0;

	/*
	 * we're taking on responsibility for handling used / unused eb
	 * when we leave, via lws_buflist_aware_finished_consuming()
	 */

//	lwsl_notice("%s: eb.len %d ENTRY chunk remaining %d\n", __func__, eb.len,
//			wsi->chunk_remaining);

	/* allow the source to signal he has data again next time */
	if (lws_change_pollfd(wsi, 0, LWS_POLLIN))
		return -1;

	if (buffered < 0) {
		lwsl_debug("%s: SSL capable error\n", __func__);
		return -1;
	}

	if (eb.len <= 0)
		return 0;

	*len = eb.len;
	wsi->client_rx_avail = 0;

	/*
	 * server may insist on transfer-encoding: chunked,
	 * so http client must deal with it
	 */
spin_chunks:
	//lwsl_notice("%s: len %d SPIN chunk remaining %d\n", __func__, *len,
	//		wsi->chunk_remaining);
	while (wsi->chunked && (wsi->chunk_parser != ELCP_CONTENT) && *len) {
		switch (wsi->chunk_parser) {
		case ELCP_HEX:
			if ((*buf)[0] == '\x0d') {
				wsi->chunk_parser = ELCP_CR;
				break;
			}
			n = char_to_hex((*buf)[0]);
			if (n < 0) {
				lwsl_err("%s: chunking failure A\n", __func__);
				return -1;
			}
			wsi->chunk_remaining <<= 4;
			wsi->chunk_remaining |= n;
			break;
		case ELCP_CR:
			if ((*buf)[0] != '\x0a') {
				lwsl_err("%s: chunking failure B\n", __func__);
				return -1;
			}
			if (wsi->chunk_remaining) {
				wsi->chunk_parser = ELCP_CONTENT;
				//lwsl_notice("starting chunk size %d (block rem %d)\n",
				//		wsi->chunk_remaining, *len);
				break;
			}

			wsi->chunk_parser = ELCP_TRAILER_CR;
			break;

		case ELCP_CONTENT:
			break;

		case ELCP_POST_CR:
			if ((*buf)[0] != '\x0d') {
				lwsl_err("%s: chunking failure C\n", __func__);
				lwsl_hexdump_err(*buf, *len);

				return -1;
			}

			wsi->chunk_parser = ELCP_POST_LF;
			break;

		case ELCP_POST_LF:
			if ((*buf)[0] != '\x0a') {
				lwsl_err("%s: chunking failure D\n", __func__);

				return -1;
			}

			wsi->chunk_parser = ELCP_HEX;
			wsi->chunk_remaining = 0;
			break;

		case ELCP_TRAILER_CR:
			if ((*buf)[0] != '\x0d') {
				lwsl_err("%s: chunking failure F\n", __func__);
				lwsl_hexdump_err(*buf, *len);

				return -1;
			}

			wsi->chunk_parser = ELCP_TRAILER_LF;
			break;

		case ELCP_TRAILER_LF:
			if ((*buf)[0] != '\x0a') {
				lwsl_err("%s: chunking failure F\n", __func__);
				lwsl_hexdump_err(*buf, *len);

				return -1;
			}

			(*buf)++;
			(*len)--;
			consumed++;

			lwsl_info("final chunk\n");
			goto completed;
		}
		(*buf)++;
		(*len)--;
		consumed++;
	}

	if (wsi->chunked && !wsi->chunk_remaining)
		goto account_and_ret;

	if (wsi->http.rx_content_remain &&
	    wsi->http.rx_content_remain < (unsigned int)*len)
		n = (int)wsi->http.rx_content_remain;
	else
		n = *len;

	if (wsi->chunked && wsi->chunk_remaining &&
	    wsi->chunk_remaining < n)
		n = wsi->chunk_remaining;

#if defined(LWS_WITH_HTTP_PROXY) && defined(LWS_WITH_HUBBUB)
	/* hubbub */
	if (wsi->http.perform_rewrite)
		lws_rewrite_parse(wsi->http.rw, (unsigned char *)*buf, n);
	else
#endif
	{
		if (
#if defined(LWS_WITH_HTTP_PROXY)
		    !wsi->protocol_bind_balance ==
		    !!wsi->http.proxy_clientside
#else
		    !!wsi->protocol_bind_balance
#endif
		  ) {
			if (user_callback_handle_rxflow(wsi->protocol->callback,
				wsi, LWS_CALLBACK_RECEIVE_CLIENT_HTTP_READ,
				wsi->user_space, *buf, n)) {
				lwsl_info("%s: RECEIVE_CLIENT_HTTP_READ returned -1\n",
						__func__);

				return -1;
			}
		}